

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Preprocessor_macros.cpp
# Opt level: O1

bool __thiscall
slang::parsing::Preprocessor::expandReplacementList
          (Preprocessor *this,span<const_slang::parsing::Token,_18446744073709551615UL> *tokens,
          SmallSet<const_slang::syntax::DefineDirectiveSyntax_*,_8UL,_slang::detail::hashing::StackAllocator<const_slang::syntax::DefineDirectiveSyntax_*,_64UL,_16UL>_>
          *alreadyExpanded)

{
  char *pcVar1;
  long lVar2;
  byte bVar3;
  byte bVar4;
  undefined4 uVar5;
  DefineDirectiveSyntax *pDVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  Token TVar11;
  bool bVar12;
  bool bVar13;
  SyntaxKind SVar14;
  int iVar15;
  MacroActualArgumentListSyntax *actualArgs;
  ulong uVar16;
  SourceLocation location;
  Diagnostic *this_00;
  undefined4 extraout_var;
  Info *pIVar17;
  size_t extraout_RDX;
  uint uVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  ulong uVar22;
  bool bVar23;
  char cVar24;
  char cVar25;
  char cVar26;
  char cVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  MacroDef MVar31;
  string_view arg;
  span<const_slang::parsing::Token,_18446744073709551615UL> expanded;
  MacroParser parser;
  SmallVector<slang::parsing::Token,_16UL> expansionBuffer;
  SmallVector<slang::parsing::Token,_16UL> outBuffer;
  uint local_344;
  Token local_338;
  DefineDirectiveSyntax *local_328;
  MacroIntrinsic local_320;
  undefined2 uStack_31c;
  undefined2 uStack_31a;
  long local_318;
  long local_310;
  long local_308;
  table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
  *local_300;
  long local_2f8;
  ulong local_2f0;
  long local_2e8;
  arrays_type *local_2e0;
  span<const_slang::parsing::Token,_18446744073709551615UL> *local_2d8;
  undefined1 local_2d0 [24];
  MacroParser local_2b8;
  MacroExpansion local_298;
  SmallVectorBase<slang::parsing::Token> local_260 [7];
  SmallVectorBase<slang::parsing::Token> local_148 [7];
  
  local_148[0].data_ = (pointer)local_148[0].firstElement;
  local_148[0].len = 0;
  local_148[0].cap = 0x10;
  local_260[0].data_ = (pointer)local_260[0].firstElement;
  local_260[0].len = 0;
  local_260[0].cap = 0x10;
  local_2b8.buffer._M_ptr = tokens->_M_ptr;
  local_2b8.buffer._M_extent._M_extent_value = (tokens->_M_extent)._M_extent_value;
  local_2b8.currentIndex = 0;
  local_2d8 = tokens;
  local_2b8.pp = this;
  Token::Token(&local_338);
  local_300 = (table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
               *)&(alreadyExpanded->super_Storage).field_0x48;
  local_2e0 = (arrays_type *)&alreadyExpanded->field_0x50;
  bVar13 = false;
  do {
    while( true ) {
      local_338 = MacroParser::next(&local_2b8);
      pIVar17 = local_338.info;
      if (pIVar17 == (Info *)0x0) {
        if (bVar13) {
          iVar15 = SmallVectorBase<slang::parsing::Token>::copy
                             (local_148,(EVP_PKEY_CTX *)this->alloc,(EVP_PKEY_CTX *)0x0);
          local_2d8->_M_ptr = (pointer)CONCAT44(extraout_var,iVar15);
          (local_2d8->_M_extent)._M_extent_value = extraout_RDX;
        }
        goto LAB_001c88cc;
      }
      if ((local_338.kind == Directive) &&
         (SVar14 = Token::directiveKind(&local_338), SVar14 == MacroUsage)) break;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (local_148,&local_338);
    }
    MVar31 = findMacro(this,local_338);
    local_328 = MVar31.syntax;
    local_320 = MVar31.intrinsic;
    uStack_31c = MVar31._12_2_;
    if (local_320 == None && local_328 == (DefineDirectiveSyntax *)0x0) {
      bVar23 = false;
      SmallVectorBase<slang::parsing::Token>::emplace_back<slang::parsing::Token_const&>
                (local_148,&local_338);
    }
    else {
      if (local_320 == None) {
        auVar9._8_8_ = 0;
        auVar9._0_8_ = local_328;
        uVar16 = SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar9 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar22 = uVar16 >> (alreadyExpanded->field_0x50 & 0x3f);
        uVar5 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar16 & 0xff];
        uVar19 = 0;
        do {
          pcVar1 = (char *)(*(long *)&alreadyExpanded->field_0x60 + uVar22 * 0x10);
          cVar24 = (char)uVar5;
          auVar29[0] = -(*pcVar1 == cVar24);
          cVar25 = (char)((uint)uVar5 >> 8);
          auVar29[1] = -(pcVar1[1] == cVar25);
          cVar26 = (char)((uint)uVar5 >> 0x10);
          auVar29[2] = -(pcVar1[2] == cVar26);
          cVar27 = (char)((uint)uVar5 >> 0x18);
          auVar29[3] = -(pcVar1[3] == cVar27);
          auVar29[4] = -(pcVar1[4] == cVar24);
          auVar29[5] = -(pcVar1[5] == cVar25);
          auVar29[6] = -(pcVar1[6] == cVar26);
          auVar29[7] = -(pcVar1[7] == cVar27);
          auVar29[8] = -(pcVar1[8] == cVar24);
          auVar29[9] = -(pcVar1[9] == cVar25);
          auVar29[10] = -(pcVar1[10] == cVar26);
          auVar29[0xb] = -(pcVar1[0xb] == cVar27);
          auVar29[0xc] = -(pcVar1[0xc] == cVar24);
          auVar29[0xd] = -(pcVar1[0xd] == cVar25);
          auVar29[0xe] = -(pcVar1[0xe] == cVar26);
          auVar29[0xf] = -(pcVar1[0xf] == cVar27);
          uVar18 = (uint)(ushort)((ushort)(SUB161(auVar29 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar29 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar29 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar29 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar29 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar29 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar29 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar29 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar29 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar29 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar29 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar29 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar29 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar29 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar29 >> 0x77,0) & 1) << 0xe);
          if (uVar18 != 0) {
            local_2f8 = *(long *)&alreadyExpanded->field_0x68 + uVar22 * 0x78;
            do {
              uVar7 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              if (local_328 == *(DefineDirectiveSyntax **)(local_2f8 + (ulong)uVar7 * 8)) {
                local_2f8 = local_2f8 + (ulong)uVar7 * 8;
                goto LAB_001c85fd;
              }
              uVar18 = uVar18 - 1 & uVar18;
            } while (uVar18 != 0);
          }
          if ((*(byte *)(uVar22 * 0x10 + *(long *)&alreadyExpanded->field_0x60 + 0xf) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7]) == 0) break;
          lVar21 = uVar22 + uVar19;
          uVar19 = uVar19 + 1;
          uVar22 = lVar21 + 1U & *(ulong *)&alreadyExpanded->field_0x58;
        } while (uVar19 <= *(ulong *)&alreadyExpanded->field_0x58);
        local_2f8 = 0;
LAB_001c85fd:
        if (local_2f8 != 0) {
          location = Token::location(&local_338);
          this_00 = addDiag(this,(DiagCode)0x150004,location);
          arg = Token::valueText(&local_338);
          bVar23 = true;
          Diagnostic::operator<<(this_00,arg);
          goto LAB_001c8865;
        }
      }
      if ((local_328 == (DefineDirectiveSyntax *)0x0) ||
         (local_328->formalArguments == (MacroFormalArgumentListSyntax *)0x0)) {
        actualArgs = (MacroActualArgumentListSyntax *)0x0;
      }
      else {
        actualArgs = MacroParser::parseActualArgumentList(&local_2b8,local_338);
        if (actualArgs == (MacroActualArgumentListSyntax *)0x0) {
          bVar23 = true;
          goto LAB_001c8865;
        }
      }
      TVar11 = local_338;
      local_260[0].len = 0;
      local_298.sourceManager = this->sourceManager;
      local_298.alloc = this->alloc;
      local_298.dest = local_260;
      local_298.usageSite.kind = local_338.kind;
      local_298.usageSite._2_1_ = local_338._2_1_;
      local_298.usageSite.numFlags.raw = local_338.numFlags.raw;
      local_298.usageSite.rawLen = local_338.rawLen;
      local_298.usageSite.info = local_338.info;
      local_298.any = false;
      local_298.isTopLevel = false;
      MVar31.intrinsic = local_320;
      MVar31.syntax = local_328;
      MVar31.builtIn = (bool)(undefined1)uStack_31c;
      MVar31.commandLine = (bool)uStack_31c._1_1_;
      MVar31._14_2_ = uStack_31a;
      local_338 = TVar11;
      bVar12 = expandMacro(this,MVar31,&local_298,actualArgs);
      bVar23 = true;
      if (bVar12) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = local_328;
        uVar19 = SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                 SUB168(auVar8 * ZEXT816(0x9e3779b97f4a7c15),0);
        uVar16 = uVar19 >> (alreadyExpanded->field_0x50 & 0x3f);
        uVar5 = (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::match_word(unsigned_long)
                  ::word)[uVar19 & 0xff];
        local_2e8 = *(long *)&alreadyExpanded->field_0x68;
        local_2f0 = *(ulong *)&alreadyExpanded->field_0x58;
        uVar20 = 0;
        uVar22 = uVar16;
        do {
          pcVar1 = (char *)(*(long *)&alreadyExpanded->field_0x60 + uVar22 * 0x10);
          cVar24 = (char)uVar5;
          auVar28[0] = -(*pcVar1 == cVar24);
          cVar25 = (char)((uint)uVar5 >> 8);
          auVar28[1] = -(pcVar1[1] == cVar25);
          cVar26 = (char)((uint)uVar5 >> 0x10);
          auVar28[2] = -(pcVar1[2] == cVar26);
          cVar27 = (char)((uint)uVar5 >> 0x18);
          auVar28[3] = -(pcVar1[3] == cVar27);
          auVar28[4] = -(pcVar1[4] == cVar24);
          auVar28[5] = -(pcVar1[5] == cVar25);
          auVar28[6] = -(pcVar1[6] == cVar26);
          auVar28[7] = -(pcVar1[7] == cVar27);
          auVar28[8] = -(pcVar1[8] == cVar24);
          auVar28[9] = -(pcVar1[9] == cVar25);
          auVar28[10] = -(pcVar1[10] == cVar26);
          auVar28[0xb] = -(pcVar1[0xb] == cVar27);
          auVar28[0xc] = -(pcVar1[0xc] == cVar24);
          auVar28[0xd] = -(pcVar1[0xd] == cVar25);
          auVar28[0xe] = -(pcVar1[0xe] == cVar26);
          auVar28[0xf] = -(pcVar1[0xf] == cVar27);
          uVar18 = (uint)(ushort)((ushort)(SUB161(auVar28 >> 7,0) & 1) |
                                  (ushort)(SUB161(auVar28 >> 0xf,0) & 1) << 1 |
                                  (ushort)(SUB161(auVar28 >> 0x17,0) & 1) << 2 |
                                  (ushort)(SUB161(auVar28 >> 0x1f,0) & 1) << 3 |
                                  (ushort)(SUB161(auVar28 >> 0x27,0) & 1) << 4 |
                                  (ushort)(SUB161(auVar28 >> 0x2f,0) & 1) << 5 |
                                  (ushort)(SUB161(auVar28 >> 0x37,0) & 1) << 6 |
                                  (ushort)(SUB161(auVar28 >> 0x3f,0) & 1) << 7 |
                                  (ushort)(SUB161(auVar28 >> 0x47,0) & 1) << 8 |
                                  (ushort)(SUB161(auVar28 >> 0x4f,0) & 1) << 9 |
                                  (ushort)(SUB161(auVar28 >> 0x57,0) & 1) << 10 |
                                  (ushort)(SUB161(auVar28 >> 0x5f,0) & 1) << 0xb |
                                  (ushort)(SUB161(auVar28 >> 0x67,0) & 1) << 0xc |
                                  (ushort)(SUB161(auVar28 >> 0x6f,0) & 1) << 0xd |
                                 (ushort)(SUB161(auVar28 >> 0x77,0) & 1) << 0xe);
          if (uVar18 != 0) {
            lVar21 = local_2e8 + uVar22 * 0x78;
            do {
              uVar7 = 0;
              if (uVar18 != 0) {
                for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                }
              }
              if (local_328 == *(DefineDirectiveSyntax **)(lVar21 + (ulong)uVar7 * 8)) {
                lVar21 = lVar21 + (ulong)uVar7 * 8;
                local_308 = lVar21;
                goto LAB_001c864b;
              }
              uVar18 = uVar18 - 1 & uVar18;
            } while (uVar18 != 0);
          }
          if ((*(byte *)(uVar22 * 0x10 + *(long *)&alreadyExpanded->field_0x60 + 0xf) &
              (&boost::unordered::detail::foa::
                group15<boost::unordered::detail::foa::plain_integral>::
                is_not_overflowed(unsigned_long)::shift)[(uint)uVar19 & 7]) == 0) break;
          lVar21 = uVar22 + uVar20;
          uVar20 = uVar20 + 1;
          uVar22 = lVar21 + 1U & local_2f0;
        } while (uVar20 <= local_2f0);
        lVar21 = 0;
LAB_001c864b:
        if (lVar21 == 0) {
          if (*(ulong *)&alreadyExpanded->field_0x78 < *(ulong *)&alreadyExpanded->field_0x70) {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
            ::nosize_unchecked_emplace_at<slang::syntax::DefineDirectiveSyntax_const*const&>
                      ((locator *)local_2d0,local_300,local_2e0,uVar16,uVar19,&local_328);
            *(long *)&alreadyExpanded->field_0x78 = *(long *)&alreadyExpanded->field_0x78 + 1;
          }
          else {
            boost::unordered::detail::foa::
            table_core<boost::unordered::detail::foa::flat_set_types<slang::syntax::DefineDirectiveSyntax_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<slang::syntax::DefineDirectiveSyntax_const*,void>,std::equal_to<slang::syntax::DefineDirectiveSyntax_const*>,slang::detail::hashing::StackAllocator<slang::syntax::DefineDirectiveSyntax_const*,64ul,16ul>>
            ::unchecked_emplace_with_rehash<slang::syntax::DefineDirectiveSyntax_const*const&>
                      ((locator *)local_2d0,local_300,uVar19,&local_328);
          }
        }
        local_2d0._0_8_ = local_260[0].data_;
        local_2d0._8_8_ = local_260[0].len;
        local_308 = lVar21;
        bVar12 = expandReplacementList
                           (this,(span<const_slang::parsing::Token,_18446744073709551615UL> *)
                                 local_2d0,alreadyExpanded);
        bVar23 = true;
        if (bVar12) {
          auVar10._8_8_ = 0;
          auVar10._0_8_ = local_328;
          uVar16 = SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),8) ^
                   SUB168(auVar10 * ZEXT816(0x9e3779b97f4a7c15),0);
          uVar22 = uVar16 >> (alreadyExpanded->field_0x50 & 0x3f);
          uVar5 = (&boost::unordered::detail::foa::
                    group15<boost::unordered::detail::foa::plain_integral>::
                    match_word(unsigned_long)::word)[uVar16 & 0xff];
          uVar19 = 0;
          do {
            lVar21 = *(long *)&alreadyExpanded->field_0x60 + uVar22 * 0x10;
            pcVar1 = (char *)(*(long *)&alreadyExpanded->field_0x60 + uVar22 * 0x10);
            cVar24 = (char)uVar5;
            auVar30[0] = -(*pcVar1 == cVar24);
            cVar25 = (char)((uint)uVar5 >> 8);
            auVar30[1] = -(pcVar1[1] == cVar25);
            cVar26 = (char)((uint)uVar5 >> 0x10);
            auVar30[2] = -(pcVar1[2] == cVar26);
            cVar27 = (char)((uint)uVar5 >> 0x18);
            auVar30[3] = -(pcVar1[3] == cVar27);
            auVar30[4] = -(pcVar1[4] == cVar24);
            auVar30[5] = -(pcVar1[5] == cVar25);
            auVar30[6] = -(pcVar1[6] == cVar26);
            auVar30[7] = -(pcVar1[7] == cVar27);
            auVar30[8] = -(pcVar1[8] == cVar24);
            auVar30[9] = -(pcVar1[9] == cVar25);
            auVar30[10] = -(pcVar1[10] == cVar26);
            auVar30[0xb] = -(pcVar1[0xb] == cVar27);
            auVar30[0xc] = -(pcVar1[0xc] == cVar24);
            auVar30[0xd] = -(pcVar1[0xd] == cVar25);
            auVar30[0xe] = -(pcVar1[0xe] == cVar26);
            auVar30[0xf] = -(pcVar1[0xf] == cVar27);
            uVar18 = (uint)(ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                                    (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                                    (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                                    (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                                    (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                                    (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                                    (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                                    (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                                    (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                                    (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                                    (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                                    (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                                    (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                                    (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                                   (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe);
            uVar20 = (ulong)local_344;
            if (uVar18 != 0) {
              lVar2 = *(long *)&alreadyExpanded->field_0x68 + uVar22 * 0x78;
              do {
                uVar7 = 0;
                if (uVar18 != 0) {
                  for (; (uVar18 >> uVar7 & 1) == 0; uVar7 = uVar7 + 1) {
                  }
                }
                pDVar6 = *(DefineDirectiveSyntax **)(lVar2 + (ulong)uVar7 * 8);
                if (local_328 == pDVar6) {
                  local_310 = lVar2 + (ulong)uVar7 * 8;
                  uVar20 = (ulong)uVar7;
                  local_318 = lVar21;
                }
                else {
                  uVar18 = uVar18 - 1 & uVar18;
                }
                local_344 = (uint)uVar20;
                if (local_328 == pDVar6) goto LAB_001c87dd;
              } while (uVar18 != 0);
            }
            if ((*(byte *)(lVar21 + 0xf) &
                (&boost::unordered::detail::foa::
                  group15<boost::unordered::detail::foa::plain_integral>::
                  is_not_overflowed(unsigned_long)::shift)[(uint)uVar16 & 7]) == 0) break;
            lVar21 = uVar22 + uVar19;
            uVar19 = uVar19 + 1;
            uVar22 = lVar21 + 1U & *(ulong *)&alreadyExpanded->field_0x58;
          } while (uVar19 <= *(ulong *)&alreadyExpanded->field_0x58);
          local_310 = 0;
          uVar20 = 0;
          local_318 = 0;
LAB_001c87dd:
          local_344 = (uint)uVar20;
          if (local_310 != 0) {
            bVar3 = (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[*(byte *)(local_318 + uVar20) & 7];
            bVar4 = *(byte *)(local_318 + uVar20 | 0xf);
            *(undefined1 *)(local_318 + uVar20) = 0;
            *(ulong *)&alreadyExpanded->field_0x70 =
                 *(long *)&alreadyExpanded->field_0x70 - (ulong)((bVar3 & bVar4) != 0);
            *(long *)&alreadyExpanded->field_0x78 = *(long *)&alreadyExpanded->field_0x78 + -1;
          }
          SmallVectorBase<slang::parsing::Token>::
          append<__gnu_cxx::__normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>_>
                    (local_148,
                     (__normal_iterator<const_slang::parsing::Token_*,_std::span<const_slang::parsing::Token,_18446744073709551615UL>_>
                      )local_2d0._0_8_,(Token *)(local_2d0._0_8_ + local_2d0._8_8_ * 0x10));
          bVar13 = true;
          bVar23 = false;
        }
      }
    }
LAB_001c8865:
  } while (!bVar23);
LAB_001c88cc:
  if (local_260[0].data_ != (pointer)local_260[0].firstElement) {
    operator_delete(local_260[0].data_);
  }
  if (local_148[0].data_ != (pointer)local_148[0].firstElement) {
    operator_delete(local_148[0].data_);
  }
  return pIVar17 == (Info *)0x0;
}

Assistant:

bool Preprocessor::expandReplacementList(
    std::span<Token const>& tokens, SmallSet<const DefineDirectiveSyntax*, 8>& alreadyExpanded) {

    SmallVector<Token, 16> outBuffer;
    SmallVector<Token, 16> expansionBuffer;

    bool expandedSomething = false;
    MacroParser parser(*this);
    parser.setBuffer(tokens);

    // loop through each token in the replacement list and expand it if it's a nested macro
    Token token;
    while ((token = parser.next())) {
        if (token.kind != TokenKind::Directive || token.directiveKind() != SyntaxKind::MacroUsage) {
            outBuffer.push_back(token);
            continue;
        }

        // lookup the macro definition
        auto macro = findMacro(token);
        if (!macro.valid()) {
            // If we couldn't find the macro, just keep trucking.
            // It's possible that a future expansion will make this valid.
            outBuffer.push_back(token);
            continue;
        }

        if (!macro.isIntrinsic() && alreadyExpanded.count(macro.syntax)) {
            addDiag(diag::RecursiveMacro, token.location()) << token.valueText();
            return false;
        }

        // parse arguments if necessary
        MacroActualArgumentListSyntax* actualArgs = nullptr;
        if (macro.needsArgs()) {
            actualArgs = parser.parseActualArgumentList(token);
            if (!actualArgs)
                return false;
        }

        expansionBuffer.clear();
        MacroExpansion expansion{sourceManager, alloc, expansionBuffer, token, false};
        if (!expandMacro(macro, expansion, actualArgs))
            return false;

        // Recursively expand out nested macros; this ensures that we detect
        // any potentially recursive macros.
        alreadyExpanded.insert(macro.syntax);
        std::span<const Token> expanded = expansionBuffer;
        if (!expandReplacementList(expanded, alreadyExpanded))
            return false;

        alreadyExpanded.erase(macro.syntax);
        outBuffer.append_range(expanded);
        expandedSomething = true;
    }

    // Make a heap copy of the tokens before we leave, if we actually expanded something.
    if (expandedSomething)
        tokens = outBuffer.copy(alloc);
    return true;
}